

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::getInfo2InternalUsingFrameOffset
          (btHingeConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  btRigidBody *pbVar5;
  btScalar *pbVar6;
  float *in_RSI;
  btHingeConstraint *in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  float fVar11;
  btVector3 bVar12;
  btScalar newc_1;
  btScalar newc;
  btScalar vel;
  btScalar bounce;
  btScalar mot_fact;
  btScalar currERP;
  btScalar histop;
  btScalar lostop;
  int powered;
  int limit;
  btScalar limit_err;
  int srow;
  btVector3 u;
  int s4;
  int s3;
  btScalar rhs;
  btScalar k;
  btScalar normalErp;
  btScalar len2;
  btVector3 totalDist;
  btVector3 orthoA;
  btVector3 projA;
  btVector3 orthoB;
  btVector3 projB;
  btVector3 q;
  btVector3 p;
  btVector3 relB;
  btVector3 relA;
  btVector3 tmpB;
  btVector3 tmpA;
  int nrow;
  int s2;
  int s1;
  int s0;
  btTransform bodyB_trans;
  btTransform bodyA_trans;
  btVector3 ax1;
  btVector3 ax1B;
  btVector3 ax1A;
  btScalar factB;
  btScalar factA;
  btScalar miS;
  bool hasStaticBody;
  btScalar miB;
  btScalar miA;
  btVector3 ofs;
  btTransform trB;
  btTransform trA;
  int s;
  int i;
  btTransform *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  btVector3 *in_stack_fffffffffffffb18;
  btVector3 *this_00;
  btMatrix3x3 *in_stack_fffffffffffffb20;
  btVector3 *this_01;
  float local_4b4;
  btTransform *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  bool local_3ed;
  int local_3c8;
  float local_3c4;
  btVector3 local_3bc;
  int local_3ac;
  int local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  btScalar local_398 [2];
  btScalar local_390 [2];
  btScalar local_388 [2];
  btScalar abStack_380 [2];
  btScalar local_378 [2];
  btScalar local_370 [2];
  btScalar local_368 [2];
  btScalar abStack_360 [2];
  btScalar local_358 [2];
  btScalar local_350 [2];
  btScalar local_348 [2];
  btScalar abStack_340 [2];
  btScalar local_338 [2];
  btScalar abStack_330 [2];
  btScalar local_328 [2];
  btScalar local_320 [2];
  btScalar local_318;
  btScalar local_314;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  btScalar local_2f0 [2];
  btScalar local_2e8 [2];
  undefined8 local_2e0;
  undefined8 local_2d8;
  btScalar local_2d0 [2];
  btScalar abStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 local_2b8;
  btScalar local_2b0 [2];
  btScalar abStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  btScalar local_280;
  undefined8 local_27c;
  undefined8 local_274;
  btScalar local_26c [2];
  btScalar abStack_264 [2];
  undefined8 local_25c;
  undefined8 local_254;
  btScalar local_24c;
  undefined8 local_248;
  undefined8 local_240;
  btScalar local_238 [2];
  btScalar abStack_230 [2];
  btVector3 local_228;
  btVector3 local_218;
  btVector3 local_208;
  btVector3 local_1f8;
  btVector3 local_1e8;
  btVector3 local_1d8;
  int local_1c0;
  int local_1bc;
  float local_1b8;
  int local_1b4;
  btTransform local_1b0;
  btTransform local_170;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  btVector3 local_110;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  float local_e0;
  btScalar local_dc;
  float local_d8;
  bool local_d1;
  btScalar local_d0;
  btScalar local_cc;
  btVector3 local_c8;
  btTransform local_b8;
  btTransform local_78;
  float local_38;
  int local_34;
  btVector3 *local_30;
  btVector3 *local_28;
  float *local_10;
  
  local_38 = in_RSI[10];
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  btTransform::operator*
            ((btTransform *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60);
  btTransform::operator*
            ((btTransform *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60);
  btTransform::getOrigin(&local_b8);
  btTransform::getOrigin(&local_78);
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_c8.m_floats._0_8_ = bVar12.m_floats._0_8_;
  local_c8.m_floats._8_8_ = bVar12.m_floats._8_8_;
  pbVar5 = getRigidBodyA(in_RDI);
  local_cc = btRigidBody::getInvMass(pbVar5);
  pbVar5 = getRigidBodyB(in_RDI);
  local_d0 = btRigidBody::getInvMass(pbVar5);
  local_3ed = local_cc < 1.1920929e-07 || local_d0 < 1.1920929e-07;
  local_d1 = local_3ed;
  local_d8 = local_cc + local_d0;
  if (local_d8 <= 0.0) {
    local_dc = 0.5;
  }
  else {
    local_dc = local_d0 / local_d8;
  }
  local_e0 = 1.0 - local_dc;
  btTransform::getBasis(&local_78);
  bVar12 = btMatrix3x3::getColumn
                     (in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  local_f0 = bVar12.m_floats._0_8_;
  local_e8 = bVar12.m_floats._8_8_;
  btTransform::getBasis(&local_b8);
  bVar12 = btMatrix3x3::getColumn
                     (in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  local_100 = bVar12.m_floats._0_8_;
  local_f8 = bVar12.m_floats._8_8_;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_120 = bVar12.m_floats._0_8_;
  local_118 = bVar12.m_floats._8_8_;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_130 = bVar12.m_floats._0_8_;
  local_128 = bVar12.m_floats._8_8_;
  bVar12 = operator+(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_110.m_floats._0_8_ = bVar12.m_floats._0_8_;
  local_110.m_floats._8_8_ = bVar12.m_floats._8_8_;
  btVector3::normalize((btVector3 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08);
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08);
  local_1b4 = 0;
  local_1b8 = local_38;
  local_1bc = (int)local_38 * 2;
  local_1c0 = 2;
  btVector3::btVector3(&local_1d8);
  btVector3::btVector3(&local_1e8);
  btVector3::btVector3(&local_1f8);
  btVector3::btVector3(&local_208);
  btVector3::btVector3(&local_218);
  btVector3::btVector3(&local_228);
  btTransform::getOrigin(&local_b8);
  btTransform::getOrigin(&local_1b0);
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_238 = bVar12.m_floats._0_8_;
  abStack_230 = bVar12.m_floats._8_8_;
  local_208.m_floats._0_8_ = local_238;
  local_208.m_floats._8_8_ = abStack_230;
  local_24c = btVector3::dot(&local_208,&local_110);
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_248 = bVar12.m_floats._0_8_;
  local_240 = bVar12.m_floats._8_8_;
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_25c = bVar12.m_floats._0_8_;
  local_254 = bVar12.m_floats._8_8_;
  btTransform::getOrigin(&local_78);
  btTransform::getOrigin(&local_170);
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_26c = bVar12.m_floats._0_8_;
  abStack_264 = bVar12.m_floats._8_8_;
  local_1f8.m_floats._0_8_ = local_26c;
  local_1f8.m_floats._8_8_ = abStack_264;
  local_280 = btVector3::dot(&local_1f8,&local_110);
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_27c = bVar12.m_floats._0_8_;
  local_274 = bVar12.m_floats._8_8_;
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_290 = bVar12.m_floats._0_8_;
  local_288 = bVar12.m_floats._8_8_;
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_2a0 = bVar12.m_floats._0_8_;
  local_298 = bVar12.m_floats._8_8_;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_2c0 = bVar12.m_floats._0_8_;
  local_2b8 = bVar12.m_floats._8_8_;
  bVar12 = operator+(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_2b0 = bVar12.m_floats._0_8_;
  abStack_2a8 = bVar12.m_floats._8_8_;
  local_1f8.m_floats._0_8_ = local_2b0;
  local_1f8.m_floats._8_8_ = abStack_2a8;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_2e0 = bVar12.m_floats._0_8_;
  local_2d8 = bVar12.m_floats._8_8_;
  bVar12 = operator-(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_2d0 = bVar12.m_floats._0_8_;
  abStack_2c8 = bVar12.m_floats._8_8_;
  local_208.m_floats._0_8_ = local_2d0;
  local_208.m_floats._8_8_ = abStack_2c8;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_300 = bVar12.m_floats._0_8_;
  local_2f8 = bVar12.m_floats._8_8_;
  bVar12 = ::operator*(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18->m_floats);
  local_310 = bVar12.m_floats._0_8_;
  local_308 = bVar12.m_floats._8_8_;
  bVar12 = operator+(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_2f0 = bVar12.m_floats._0_8_;
  local_2e8 = bVar12.m_floats._8_8_;
  local_218.m_floats._0_8_ = local_2f0;
  local_218.m_floats._8_8_ = local_2e8;
  local_314 = btVector3::length2((btVector3 *)0x20ebd2);
  if (local_314 <= 1.1920929e-07) {
    btTransform::getBasis(&local_78);
    bVar12 = btMatrix3x3::getColumn
                       (in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    local_328 = bVar12.m_floats._0_8_;
    local_320 = bVar12.m_floats._8_8_;
    local_218.m_floats._0_8_ = local_328;
    local_218.m_floats._8_8_ = local_320;
  }
  else {
    local_318 = btSqrt(0.0);
    btVector3::operator/=
              ((btVector3 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
               (btScalar *)in_stack_fffffffffffffb08);
  }
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_338 = bVar12.m_floats._0_8_;
  abStack_330 = bVar12.m_floats._8_8_;
  local_228.m_floats._0_8_ = local_338;
  local_228.m_floats._8_8_ = abStack_330;
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_348 = bVar12.m_floats._0_8_;
  abStack_340 = bVar12.m_floats._8_8_;
  local_1d8.m_floats._0_8_ = local_348;
  local_1d8.m_floats._8_8_ = abStack_340;
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_358 = bVar12.m_floats._0_8_;
  local_350 = bVar12.m_floats._8_8_;
  local_1e8.m_floats._0_8_ = local_358;
  local_1e8.m_floats._8_8_ = local_350;
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1d8);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_1b4 + local_34) * 4) = pbVar6[local_34];
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1e8);
    *(float *)(*(long *)(local_10 + 8) + (long)(local_1b4 + local_34) * 4) = -pbVar6[local_34];
  }
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_368 = bVar12.m_floats._0_8_;
  abStack_360 = bVar12.m_floats._8_8_;
  local_1d8.m_floats._0_8_ = local_368;
  local_1d8.m_floats._8_8_ = abStack_360;
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_378 = bVar12.m_floats._0_8_;
  local_370 = bVar12.m_floats._8_8_;
  local_1e8.m_floats._0_8_ = local_378;
  local_1e8.m_floats._8_8_ = local_370;
  if (((local_d1 & 1U) != 0) && (iVar4 = getSolveLimit((btHingeConstraint *)0x20ee8b), iVar4 != 0))
  {
    btVector3::operator*=(&local_1e8,&local_e0);
    btVector3::operator*=(&local_1d8,&local_dc);
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1d8);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)((int)local_1b8 + local_34) * 4) =
         pbVar6[local_34];
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1e8);
    *(float *)(*(long *)(local_10 + 8) + (long)((int)local_1b8 + local_34) * 4) = -pbVar6[local_34];
  }
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_388 = bVar12.m_floats._0_8_;
  abStack_380 = bVar12.m_floats._8_8_;
  local_1d8.m_floats._0_8_ = local_388;
  local_1d8.m_floats._8_8_ = abStack_380;
  bVar12 = btVector3::cross(in_stack_fffffffffffffb20->m_el,in_stack_fffffffffffffb18);
  local_398 = bVar12.m_floats._0_8_;
  local_390 = bVar12.m_floats._8_8_;
  local_1e8.m_floats._0_8_ = local_398;
  local_1e8.m_floats._8_8_ = local_390;
  if ((local_d1 & 1U) != 0) {
    btVector3::operator*=(&local_1e8,&local_e0);
    btVector3::operator*=(&local_1d8,&local_dc);
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1d8);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_1bc + local_34) * 4) = pbVar6[local_34];
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_1e8);
    *(float *)(*(long *)(local_10 + 8) + (long)(local_1bc + local_34) * 4) = -pbVar6[local_34];
  }
  if ((in_RDI->m_flags & 8U) == 0) {
    local_4b4 = local_10[1];
  }
  else {
    local_4b4 = in_RDI->m_normalERP;
  }
  local_39c = local_4b4;
  local_3a0 = *local_10 * local_4b4;
  if ((in_RDI->m_angularOnly & 1U) == 0) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_218);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1b4 + local_34) * 4) = pbVar6[local_34];
    }
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_228);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)((int)local_1b8 + local_34) * 4) =
           pbVar6[local_34];
    }
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_110);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1bc + local_34) * 4) = pbVar6[local_34];
    }
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_218);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1b4 + local_34) * 4) = -pbVar6[local_34];
    }
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_228);
      *(float *)(*(long *)(local_10 + 6) + (long)((int)local_1b8 + local_34) * 4) =
           -pbVar6[local_34];
    }
    for (local_34 = 0; fVar11 = local_3a0, local_34 < 3; local_34 = local_34 + 1) {
      pbVar6 = btVector3::operator_cast_to_float_(&local_110);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1bc + local_34) * 4) = -pbVar6[local_34];
    }
    bVar7 = btVector3::dot(&local_218,&local_c8);
    fVar2 = local_3a0;
    local_3a4 = fVar11 * bVar7;
    *(float *)(*(long *)(local_10 + 0xc) + (long)local_1b4 * 4) = local_3a4;
    bVar7 = btVector3::dot(&local_228,&local_c8);
    fVar11 = local_3a0;
    local_3a4 = fVar2 * bVar7;
    *(float *)(*(long *)(local_10 + 0xc) + (long)(int)local_1b8 * 4) = local_3a4;
    bVar7 = btVector3::dot(&local_110,&local_c8);
    local_3a4 = fVar11 * bVar7;
    *(float *)(*(long *)(local_10 + 0xc) + (long)local_1bc * 4) = local_3a4;
  }
  local_3a8 = (int)local_38 * 3;
  local_3ac = (int)local_38 << 2;
  this_00 = &local_218;
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(btScalar *)(*(long *)(local_10 + 4) + (long)local_3a8 * 4) = *pbVar6;
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(btScalar *)(*(long *)(local_10 + 4) + 4 + (long)local_3a8 * 4) = pbVar6[1];
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(btScalar *)(*(long *)(local_10 + 4) + 8 + (long)local_3a8 * 4) = pbVar6[2];
  this_01 = &local_228;
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(btScalar *)(*(long *)(local_10 + 4) + (long)local_3ac * 4) = *pbVar6;
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(btScalar *)(*(long *)(local_10 + 4) + 4 + (long)local_3ac * 4) = pbVar6[1];
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(btScalar *)(*(long *)(local_10 + 4) + 8 + (long)local_3ac * 4) = pbVar6[2];
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(float *)(*(long *)(local_10 + 8) + (long)local_3a8 * 4) = -*pbVar6;
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(float *)(*(long *)(local_10 + 8) + 4 + (long)local_3a8 * 4) = -pbVar6[1];
  pbVar6 = btVector3::operator_cast_to_float_(this_00);
  *(float *)(*(long *)(local_10 + 8) + 8 + (long)local_3a8 * 4) = -pbVar6[2];
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(float *)(*(long *)(local_10 + 8) + (long)local_3ac * 4) = -*pbVar6;
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(float *)(*(long *)(local_10 + 8) + 4 + (long)local_3ac * 4) = -pbVar6[1];
  pbVar6 = btVector3::operator_cast_to_float_(this_01);
  *(float *)(*(long *)(local_10 + 8) + 8 + (long)local_3ac * 4) = -pbVar6[2];
  local_3a0 = *local_10 * local_39c;
  bVar12 = btVector3::cross(this_01,this_00);
  fVar11 = local_3a0;
  local_3bc.m_floats._0_8_ = bVar12.m_floats._0_8_;
  local_3bc.m_floats._8_8_ = bVar12.m_floats._8_8_;
  bVar7 = btVector3::dot(&local_3bc,&local_218);
  fVar2 = local_3a0;
  *(float *)(*(long *)(local_10 + 0xc) + (long)local_3a8 * 4) = fVar11 * bVar7;
  bVar7 = btVector3::dot(&local_3bc,&local_228);
  *(float *)(*(long *)(local_10 + 0xc) + (long)local_3ac * 4) = fVar2 * bVar7;
  local_1c0 = 4;
  local_3c4 = 0.0;
  local_3c8 = 0;
  iVar4 = getSolveLimit((btHingeConstraint *)0x20f88f);
  if (iVar4 != 0) {
    bVar7 = btAngularLimit::getCorrection(&in_RDI->m_limit);
    local_3c4 = bVar7 * in_RDI->m_referenceSign;
    local_3c8 = 2;
    if (0.0 < local_3c4) {
      local_3c8 = 1;
    }
  }
  bVar3 = getEnableAngularMotor(in_RDI);
  if ((local_3c8 != 0) || (bVar3)) {
    local_1c0 = local_1c0 + 1;
    iVar4 = local_1c0 * (int)local_10[10];
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)iVar4 * 4) = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(iVar4 + 1) * 4) = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(iVar4 + 2) * 4) = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(float *)(*(long *)(local_10 + 8) + (long)iVar4 * 4) = -*pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(float *)(*(long *)(local_10 + 8) + (long)(iVar4 + 1) * 4) = -pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(&local_110);
    *(float *)(*(long *)(local_10 + 8) + (long)(iVar4 + 2) * 4) = -pbVar6[2];
    bVar7 = getLowerLimit((btHingeConstraint *)0x20faa2);
    bVar8 = getUpperLimit((btHingeConstraint *)0x20fab8);
    if (local_3c8 != 0) {
      if ((bVar7 == bVar8) && (!NAN(bVar7) && !NAN(bVar8))) {
        bVar3 = false;
      }
    }
    *(undefined4 *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) = 0;
    bVar10 = local_39c;
    if ((in_RDI->m_flags & 2U) != 0) {
      bVar10 = in_RDI->m_stopERP;
    }
    if (bVar3 != false) {
      if ((in_RDI->m_flags & 4U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)iVar4 * 4) = in_RDI->m_normalCFM;
      }
      bVar9 = btTypedConstraint::getMotorFactor
                        (&in_RDI->super_btTypedConstraint,in_RDI->m_hingeAngle,bVar7,bVar8,
                         in_RDI->m_motorTargetVelocity,*local_10 * bVar10);
      *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) =
           bVar9 * in_RDI->m_motorTargetVelocity * in_RDI->m_referenceSign +
           *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4);
      *(float *)(*(long *)(local_10 + 0x10) + (long)iVar4 * 4) = -in_RDI->m_maxMotorImpulse;
      *(btScalar *)(*(long *)(local_10 + 0x12) + (long)iVar4 * 4) = in_RDI->m_maxMotorImpulse;
    }
    if (local_3c8 != 0) {
      local_3a0 = *local_10 * bVar10;
      *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) =
           local_3a0 * local_3c4 + *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4);
      if ((in_RDI->m_flags & 1U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)iVar4 * 4) = in_RDI->m_stopCFM;
      }
      if ((bVar7 != bVar8) || (NAN(bVar7) || NAN(bVar8))) {
        if (local_3c8 == 1) {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)iVar4 * 4) = 0;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)iVar4 * 4) = 0x7f7fffff;
        }
        else {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)iVar4 * 4) = 0xff7fffff;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)iVar4 * 4) = 0;
        }
      }
      else {
        *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)iVar4 * 4) = 0xff7fffff;
        *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)iVar4 * 4) = 0x7f7fffff;
      }
      bVar7 = btAngularLimit::getRelaxationFactor(&in_RDI->m_limit);
      if (0.0 < bVar7) {
        bVar8 = btVector3::dot(local_28,&local_110);
        bVar10 = btVector3::dot(local_30,&local_110);
        fVar11 = bVar8 - bVar10;
        if (local_3c8 == 1) {
          if ((fVar11 < 0.0) &&
             (fVar11 = -bVar7 * fVar11,
             pfVar1 = (float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4),
             *pfVar1 <= fVar11 && fVar11 != *pfVar1)) {
            *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) = fVar11;
          }
        }
        else if ((0.0 < fVar11) &&
                (-bVar7 * fVar11 < *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4))) {
          *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) = -bVar7 * fVar11;
        }
      }
      bVar7 = btAngularLimit::getBiasFactor(&in_RDI->m_limit);
      *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4) =
           bVar7 * *(float *)(*(long *)(local_10 + 0xc) + (long)iVar4 * 4);
    }
  }
  return;
}

Assistant:

void btHingeConstraint::getInfo2InternalUsingFrameOffset(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& angVelA,const btVector3& angVelB)
{
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	// transforms in world space
	btTransform trA = transA*m_rbAFrame;
	btTransform trB = transB*m_rbBFrame;
	// pivot point
//	btVector3 pivotAInW = trA.getOrigin();
//	btVector3 pivotBInW = trB.getOrigin();
#if 1
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	// get the desired direction of hinge axis
	// as weighted sum of Z-orthos of frameA and frameB in WCS
	btVector3 ax1A = trA.getBasis().getColumn(2);
	btVector3 ax1B = trB.getBasis().getColumn(2);
	btVector3 ax1 = ax1A * factA + ax1B * factB;
	ax1.normalize();
	// fill first 3 rows 
	// we want: velA + wA x relA == velB + wB x relB
	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	int s0 = 0;
	int s1 = s;
	int s2 = s * 2;
	int nrow = 2; // last filled row
	btVector3 tmpA, tmpB, relA, relB, p, q;
	// get vector from bodyB to frameB in WCS
	relB = trB.getOrigin() - bodyB_trans.getOrigin();
	// get its projection to hinge axis
	btVector3 projB = ax1 * relB.dot(ax1);
	// get vector directed from bodyB to hinge axis (and orthogonal to it)
	btVector3 orthoB = relB - projB;
	// same for bodyA
	relA = trA.getOrigin() - bodyA_trans.getOrigin();
	btVector3 projA = ax1 * relA.dot(ax1);
	btVector3 orthoA = relA - projA;
	btVector3 totalDist = projA - projB;
	// get offset vectors relA and relB
	relA = orthoA + totalDist * factA;
	relB = orthoB - totalDist * factB;
	// now choose average ortho to hinge axis
	p = orthoB * factA + orthoA * factB;
	btScalar len2 = p.length2();
	if(len2 > SIMD_EPSILON)
	{
		p /= btSqrt(len2);
	}
	else
	{
		p = trA.getBasis().getColumn(1);
	}
	// make one more ortho
	q = ax1.cross(p);
	// fill three rows
	tmpA = relA.cross(p);
	tmpB = relB.cross(p);
    for (i=0; i<3; i++) info->m_J1angularAxis[s0+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s0+i] = -tmpB[i];
	tmpA = relA.cross(q);
	tmpB = relB.cross(q);
	if(hasStaticBody && getSolveLimit())
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation if angular limit is hit
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s1+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s1+i] = -tmpB[i];
	tmpA = relA.cross(ax1);
	tmpB = relB.cross(ax1);
	if(hasStaticBody)
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];

	btScalar normalErp = (m_flags & BT_HINGE_FLAGS_ERP_NORM)? m_normalERP : info->erp;
	btScalar k = info->fps * normalErp;

	if (!m_angularOnly)
	{
		for (i=0; i<3; i++) info->m_J1linearAxis[s0+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s1+i] = q[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = ax1[i];

		for (i=0; i<3; i++) info->m_J2linearAxis[s0+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s1+i] = -q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -ax1[i];

	// compute three elements of right hand side
	
		btScalar rhs = k * p.dot(ofs);
		info->m_constraintError[s0] = rhs;
		rhs = k * q.dot(ofs);
		info->m_constraintError[s1] = rhs;
		rhs = k * ax1.dot(ofs);
		info->m_constraintError[s2] = rhs;
	}
	// the hinge axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the hinge axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the hinge axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	int s3 = 3 * s;
	int s4 = 4 * s;
	info->m_J1angularAxis[s3 + 0] = p[0];
	info->m_J1angularAxis[s3 + 1] = p[1];
	info->m_J1angularAxis[s3 + 2] = p[2];
	info->m_J1angularAxis[s4 + 0] = q[0];
	info->m_J1angularAxis[s4 + 1] = q[1];
	info->m_J1angularAxis[s4 + 2] = q[2];

	info->m_J2angularAxis[s3 + 0] = -p[0];
	info->m_J2angularAxis[s3 + 1] = -p[1];
	info->m_J2angularAxis[s3 + 2] = -p[2];
	info->m_J2angularAxis[s4 + 0] = -q[0];
	info->m_J2angularAxis[s4 + 1] = -q[1];
	info->m_J2angularAxis[s4 + 2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the hinge back into alignment.
	// if ax1A,ax1B are the unit length hinge axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
	k = info->fps * normalErp;//??

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[s3] = k * u.dot(p);
	info->m_constraintError[s4] = k * u.dot(q);
#endif
	// check angular limits
	nrow = 4; // last filled row
	int srow;
	btScalar limit_err = btScalar(0.0);
	int limit = 0;
	if(getSolveLimit())
	{
#ifdef	_BT_USE_CENTER_LIMIT_
	limit_err = m_limit.getCorrection() * m_referenceSign;
#else
	limit_err = m_correction * m_referenceSign;
#endif
	limit = (limit_err > btScalar(0.0)) ? 1 : 2;

	}
	// if the hinge has joint limits or motor, add in the extra row
	int powered = 0;
	if(getEnableAngularMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerLimit();
		btScalar histop = getUpperLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = btScalar(0.0f);
		btScalar currERP = (m_flags & BT_HINGE_FLAGS_ERP_STOP) ? m_stopERP : normalErp;
		if(powered)
		{
			if(m_flags & BT_HINGE_FLAGS_CFM_NORM)
			{
				info->cfm[srow] = m_normalCFM;
			}
			btScalar mot_fact = getMotorFactor(m_hingeAngle, lostop, histop, m_motorTargetVelocity, info->fps * currERP);
			info->m_constraintError[srow] += mot_fact * m_motorTargetVelocity * m_referenceSign;
			info->m_lowerLimit[srow] = - m_maxMotorImpulse;
			info->m_upperLimit[srow] =   m_maxMotorImpulse;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_HINGE_FLAGS_CFM_STOP)
			{
				info->cfm[srow] = m_stopCFM;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
#ifdef	_BT_USE_CENTER_LIMIT_
			btScalar bounce = m_limit.getRelaxationFactor();
#else
			btScalar bounce = m_relaxationFactor;
#endif
			if(bounce > btScalar(0.0))
			{
				btScalar vel = angVelA.dot(ax1);
				vel -= angVelB.dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
#ifdef	_BT_USE_CENTER_LIMIT_
			info->m_constraintError[srow] *= m_limit.getBiasFactor();
#else
			info->m_constraintError[srow] *= m_biasFactor;
#endif
		} // if(limit)
	} // if angular limit or powered
}